

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O3

int __thiscall jrtplib::RTPSession::SetDefaultMark(RTPSession *this,bool m)

{
  int iVar1;
  
  iVar1 = -0x3e;
  if ((this->created == true) && (iVar1 = -0x14, (this->packetbuilder).init == true)) {
    (this->packetbuilder).defmarkset = true;
    (this->packetbuilder).defaultmark = m;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPSession::SetDefaultMark(bool m)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;

	BUILDER_LOCK
	status = packetbuilder.SetDefaultMark(m);
	BUILDER_UNLOCK
	return status;
}